

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int m_se_decode(aec_stream_conflict *strm)

{
  uint uVar1;
  uint32_t uVar2;
  internal_state_conflict *piVar3;
  byte *pbVar4;
  uint32_t *puVar5;
  ulong uVar6;
  bool bVar7;
  internal_state_conflict *state;
  int in_EDX;
  int iVar8;
  uint32_t uVar9;
  size_t sVar10;
  ulong uVar11;
  
  piVar3 = strm->state;
LAB_00104ea7:
  uVar1 = piVar3->sample_counter;
  if (strm->block_size <= uVar1) {
    piVar3->mode = m_next_cds;
    return 1;
  }
  if (piVar3->bitp < 1) {
    sVar10 = strm->avail_in;
    iVar8 = piVar3->bitp + -8;
    do {
      sVar10 = sVar10 - 1;
      if (sVar10 == 0xffffffffffffffff) goto LAB_0010501d;
      strm->avail_in = sVar10;
      uVar11 = piVar3->acc << 8;
      piVar3->acc = uVar11;
      pbVar4 = strm->next_in;
      strm->next_in = pbVar4 + 1;
      piVar3->acc = *pbVar4 | uVar11;
      piVar3->bitp = iVar8 + 0x10;
      iVar8 = iVar8 + 8;
    } while (iVar8 < -7);
  }
  uVar11 = piVar3->acc;
  uVar6 = uVar11 >> ((ulong)(byte)((char)piVar3->bitp - 1) & 0x3f);
  iVar8 = piVar3->bitp;
  while ((uVar6 & 1) == 0) {
    if (iVar8 == 1) {
      if (strm->avail_in == 0) goto LAB_0010501d;
      strm->avail_in = strm->avail_in - 1;
      piVar3->acc = uVar11 << 8;
      pbVar4 = strm->next_in;
      strm->next_in = pbVar4 + 1;
      uVar11 = uVar11 << 8 | (ulong)*pbVar4;
      piVar3->acc = uVar11;
      piVar3->bitp = 9;
      iVar8 = 9;
    }
    piVar3->fs = piVar3->fs + 1;
    piVar3->bitp = iVar8 + -1;
    uVar6 = uVar11 >> ((ulong)(byte)((char)iVar8 - 2) & 0x3f);
    iVar8 = iVar8 + -1;
  }
  uVar2 = piVar3->fs;
  if ((long)(int)uVar2 < 0x5b) {
    uVar9 = uVar2 - piVar3->se_table[(long)(int)uVar2 * 2 + 1];
    if ((uVar1 & 1) == 0) {
      uVar11 = strm->avail_out;
      bVar7 = false;
      iVar8 = 0;
      if (uVar11 < piVar3->bytes_per_sample) goto LAB_00105022;
      iVar8 = piVar3->se_table[(int)(uVar2 * 2)];
      puVar5 = piVar3->rsip;
      piVar3->rsip = puVar5 + 1;
      *puVar5 = iVar8 - uVar9;
      strm->avail_out = uVar11 - piVar3->bytes_per_sample;
      piVar3->sample_counter = piVar3->sample_counter + 1;
    }
    uVar11 = strm->avail_out;
    bVar7 = false;
    iVar8 = 0;
    if (piVar3->bytes_per_sample <= uVar11) {
      puVar5 = piVar3->rsip;
      piVar3->rsip = puVar5 + 1;
      *puVar5 = uVar9;
      strm->avail_out = uVar11 - piVar3->bytes_per_sample;
      piVar3->sample_counter = piVar3->sample_counter + 1;
      piVar3->fs = 0;
      piVar3->bitp = piVar3->bitp + -1;
      bVar7 = true;
      iVar8 = in_EDX;
    }
  }
  else {
    bVar7 = false;
    iVar8 = -1;
  }
  goto LAB_00105022;
LAB_0010501d:
  iVar8 = 0;
  bVar7 = false;
LAB_00105022:
  in_EDX = iVar8;
  if (!bVar7) {
    return iVar8;
  }
  goto LAB_00104ea7;
}

Assistant:

static int m_se_decode(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    while(state->sample_counter < strm->block_size) {
        int32_t m;
        int32_t d1;
        if (fs_ask(strm) == 0)
            return M_EXIT;
        m = state->fs;
        if (m > SE_TABLE_SIZE)
            return M_ERROR;
        d1 = m - state->se_table[2 * m + 1];

        if ((state->sample_counter & 1) == 0) {
            if (strm->avail_out < state->bytes_per_sample)
                return M_EXIT;
            put_sample(strm, state->se_table[2 * m] - d1);
            state->sample_counter++;
        }

        if (strm->avail_out < state->bytes_per_sample)
            return M_EXIT;
        put_sample(strm, d1);
        state->sample_counter++;
        fs_drop(strm);
    }

    state->mode = m_next_cds;
    return M_CONTINUE;
}